

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimistic_data_writer.cpp
# Opt level: O3

void __thiscall
duckdb::OptimisticDataWriter::FlushToDisk(OptimisticDataWriter *this,RowGroup *row_group)

{
  ColumnDefinition *pCVar1;
  CompressionType *__args;
  ColumnDefinition *column;
  ColumnDefinition *this_00;
  vector<duckdb::CompressionType,_true> compression_types;
  RowGroupWriteInfo info;
  vector<duckdb::CompressionType,_true> local_88;
  RowGroupWriteData local_70;
  RowGroupWriteInfo local_40;
  
  local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_finish = (CompressionType *)0x0;
  local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (CompressionType *)0x0;
  pCVar1 = (this->table->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->table->column_definitions).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    __args = ColumnDefinition::CompressionType(this_00);
    if (local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
        super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
        super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<duckdb::CompressionType,std::allocator<duckdb::CompressionType>>::
      _M_realloc_insert<duckdb::CompressionType_const&>
                ((vector<duckdb::CompressionType,std::allocator<duckdb::CompressionType>> *)
                 &local_88,
                 (iterator)
                 local_88.
                 super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
                 super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__args);
    }
    else {
      *local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
       super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl
       .super__Vector_impl_data._M_finish = *__args;
      local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
      super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
           super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  local_40.manager =
       unique_ptr<duckdb::PartialBlockManager,_std::default_delete<duckdb::PartialBlockManager>,_true>
       ::operator*(&this->partial_manager);
  local_40.checkpoint_type = FULL_CHECKPOINT;
  local_40.compression_types = &local_88;
  RowGroup::WriteToDisk(&local_70,row_group,&local_40);
  ::std::vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>::~vector
            (&local_70.statistics.
              super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCheckpointState,_std::default_delete<duckdb::ColumnCheckpointState>,_true>_>_>
             *)&local_70);
  if (local_88.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
      super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
                    super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void OptimisticDataWriter::FlushToDisk(RowGroup &row_group) {
	//! The set of column compression types (if any)
	vector<CompressionType> compression_types;
	D_ASSERT(compression_types.empty());
	for (auto &column : table.Columns()) {
		compression_types.push_back(column.CompressionType());
	}
	RowGroupWriteInfo info(*partial_manager, compression_types);
	row_group.WriteToDisk(info);
}